

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::DMSegment::Copy(DMSegment *this,DMSegment *rhs)

{
  DMSegment *rhs_local;
  DMSegment *this_local;
  
  InterchangeObject::Copy(&this->super_InterchangeObject,&rhs->super_InterchangeObject);
  UL::operator=(&this->DataDefinition,&rhs->DataDefinition);
  (this->Duration).m_property = (rhs->Duration).m_property;
  (this->Duration).m_has_value = (rhs->Duration).m_has_value;
  (this->EventStartPosition).m_property = (rhs->EventStartPosition).m_property;
  (this->EventStartPosition).m_has_value = (rhs->EventStartPosition).m_has_value;
  optional_property<ASDCP::MXF::UTF16String>::operator=(&this->EventComment,&rhs->EventComment);
  Kumu::UUID::operator=(&this->DMFramework,&rhs->DMFramework);
  return;
}

Assistant:

void
DMSegment::Copy(const DMSegment& rhs)
{
  InterchangeObject::Copy(rhs);
  DataDefinition = rhs.DataDefinition;
  Duration = rhs.Duration;
  EventStartPosition = rhs.EventStartPosition;
  EventComment = rhs.EventComment;
  DMFramework = rhs.DMFramework;
}